

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_fd92b::Utf8Test_Proto3FieldValidates_Test::~Utf8Test_Proto3FieldValidates_Test
          (Utf8Test_Proto3FieldValidates_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Utf8Test, Proto3FieldValidates) {
  upb::Arena arena;
  size_t size;
  char* data = GetBadUtf8Payload(arena.ptr(), &size);

  upb_test_TestUtf8Proto3String* msg =
      upb_test_TestUtf8Proto3String_new(arena.ptr());

  upb_DecodeStatus status = upb_Decode(
      data, size, UPB_UPCAST(msg), &upb_0test__TestUtf8Proto3String_msg_init,
      nullptr, 0, arena.ptr());

  // Parse fails, because proto3 string fields validate UTF-8.
  ASSERT_EQ(kUpb_DecodeStatus_BadUtf8, status);
}